

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O2

void __thiscall Minisat::Solver::~Solver(Solver *this)

{
  OnlineProofChecker *this_00;
  
  this->_vptr_Solver = (_func_int **)&PTR__Solver_001389b8;
  this_00 = this->onlineDratChecker;
  if (this_00 != (OnlineProofChecker *)0x0) {
    OnlineProofChecker::~OnlineProofChecker(this_00);
    operator_delete(this_00);
  }
  this->onlineDratChecker = (OnlineProofChecker *)0x0;
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->top_trail_soln).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->ls_best_soln).super__Vector_base<char,_std::allocator<char>_>);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&(this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>);
  CCNR::ls_solver::~ls_solver(&this->ccnr);
  vec<Minisat::Lit>::~vec(&this->involved_lits);
  vec<int>::~vec(&this->pathCs);
  vec<double>::~vec(&this->var_iLevel_tmp);
  vec<double>::~vec(&this->var_iLevel);
  vec<unsigned_int>::~vec(&(this->simplifyBuffer).ring);
  vec<unsigned_int>::~vec(&this->simp_reason_clause);
  vec<Minisat::Lit>::~vec(&this->simp_learnt_clause);
  vec<char>::~vec(&this->check_hit_vec);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&this->O);
  vec<unsigned_long>::~vec(&this->M);
  vec<unsigned_long>::~vec(&this->seen2);
  vec<Minisat::Lit>::~vec(&this->add_oc);
  vec<Minisat::Lit>::~vec(&this->add_tmp);
  vec<Minisat::Lit>::~vec(&this->analyze_toclear);
  vec<Minisat::Lit>::~vec(&this->analyze_stack);
  vec<char>::~vec(&this->seen);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>);
  RegionAllocator<unsigned_int>::~RegionAllocator(&(this->ca).super_RegionAllocator<unsigned_int>);
  vec<int>::~vec(&(this->lbd_queue).q);
  vec<Minisat::Lit>::~vec(&this->learnt_clause);
  vec<Minisat::Lit>::~vec(&(this->satChecker).check_formula);
  Heap<Minisat::Solver::VarOrderLt>::~Heap(&this->order_heap_DISTANCE);
  Heap<Minisat::Solver::VarOrderLt>::~Heap(&this->order_heap_CHB);
  Heap<Minisat::Solver::VarOrderLt>::~Heap(&this->order_heap_VSIDS);
  vec<int>::~vec(&this->distance_level_incs);
  vec<int>::~vec(&this->decision_rebuild_vars);
  vec<Minisat::Lit>::~vec(&this->assumptions);
  vec<unsigned_int>::~vec(&this->oldreasons);
  vec<Minisat::Lit>::~vec(&this->old_trail);
  vec<Minisat::Solver::VarData>::~vec(&this->vardata);
  vec<int>::~vec(&this->trail_lim);
  vec<Minisat::Lit>::~vec(&this->trail);
  vec<char>::~vec(&this->decision);
  vec<char>::~vec(&this->polarity);
  vec<Minisat::lbool>::~vec(&this->assigns);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::~OccLists
            (&this->watches);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::~OccLists
            (&this->watches_bin);
  vec<double>::~vec(&this->activity_distance);
  vec<double>::~vec(&this->activity_VSIDS);
  vec<double>::~vec(&this->activity_CHB);
  vec<unsigned_int>::~vec(&this->learnts_local);
  vec<unsigned_int>::~vec(&this->learnts_tier2);
  vec<unsigned_int>::~vec(&this->learnts_core);
  vec<unsigned_int>::~vec(&this->clauses);
  vec<Minisat::Solver::watchItem>::~vec(&this->lazySATwatch);
  vec<unsigned_int>::~vec(&this->canceled);
  vec<unsigned_int>::~vec(&this->almost_conflicted);
  vec<unsigned_int>::~vec(&this->conflicted);
  vec<unsigned_int>::~vec(&this->picked);
  vec<Minisat::Lit>::~vec(&this->conflict);
  vec<Minisat::lbool>::~vec(&this->model);
  return;
}

Assistant:

Solver::~Solver()
{
    if (onlineDratChecker) delete onlineDratChecker;
    onlineDratChecker = NULL;
}